

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntryGetOwnPropertyDescriptor
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  RecyclableObject *propertyKey;
  Var pvVar7;
  int in_stack_00000010;
  undefined4 local_50;
  undefined4 uStack_4c;
  Type TStack_48;
  CallInfo local_40;
  CallInfo callInfo_local;
  Var result;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x293,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce0f10;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  result = (Var)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,&local_40);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x296,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00ce0f10:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((ulong)result & 0xfffffe) == 0) {
    pRVar6 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar6 = (RecyclableObject *)Arguments::operator[]((Arguments *)&result,1);
  }
  pRVar6 = JavascriptOperators::ToObject(pRVar6,pSVar1);
  if (((pRVar6->type).ptr)->typeId == TypeIds_HostDispatch) {
    local_50 = (uint)result;
    uStack_4c = result._4_4_;
    TStack_48._0_4_ = args.super_Arguments.Info._0_4_;
    TStack_48._4_4_ = args.super_Arguments.Info._4_4_;
    iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])
                      (pRVar6,EntryGetOwnPropertyDescriptor,&local_50,&callInfo_local);
    if (iVar4 != 0) {
      return (Var)callInfo_local;
    }
  }
  if (((uint)result & 0xffffff) < 3) {
    propertyKey = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  undefinedValue.ptr;
  }
  else {
    propertyKey = (RecyclableObject *)Arguments::operator[]((Arguments *)&result,2);
  }
  pvVar7 = GetOwnPropertyDescriptorHelper(pRVar6,propertyKey,pSVar1);
  return pvVar7;
}

Assistant:

Var JavascriptObject::EntryGetOwnPropertyDescriptor(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    RecyclableObject* obj = nullptr;
    if (args.Info.Count < 2)
    {
        obj = JavascriptOperators::ToObject(scriptContext->GetLibrary()->GetUndefined(), scriptContext);
    }
    else
    {
        // Convert the argument to object first
        obj = JavascriptOperators::ToObject(args[1], scriptContext);
    }

    // If the object is HostDispatch try to invoke the operation remotely
    if (obj->GetTypeId() == TypeIds_HostDispatch)
    {
        Var result;
        if (obj->InvokeBuiltInOperationRemotely(EntryGetOwnPropertyDescriptor, args, &result))
        {
            return result;
        }
    }

    Var propertyKey = args.Info.Count > 2 ? args[2] : obj->GetLibrary()->GetUndefined();

    return JavascriptObject::GetOwnPropertyDescriptorHelper(obj, propertyKey, scriptContext);
}